

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O0

void * tlp_mwr_data(tlp_mr_hdr *mh)

{
  tlp_mr_hdr *local_20;
  void *p;
  int n;
  tlp_mr_hdr *mh_local;
  
  if (((mh->tlp).fmt_type & 0x20) == 0) {
    local_20 = (tlp_mr_hdr *)&mh[1].requester;
  }
  else {
    local_20 = mh + 2;
  }
  p = local_20;
  if (((mh->field_0x7 & 0xf) != 0) && ((mh->field_0x7 & 0xf) != 0xf)) {
    n = 0;
    while ((n < 4 && (((uint)(mh->field_0x7 & 0xf) & 1 << ((byte)n & 0x1f)) == 0))) {
      p = (void *)((long)p + 1);
      n = n + 1;
    }
  }
  return p;
}

Assistant:

void *tlp_mwr_data(struct tlp_mr_hdr *mh)
{
	int n;
	void *p;

	p = tlp_is_3dw(mh->tlp.fmt_type) ?
		((char *)(mh + 1)) + 4 : ((char *)(mh + 1)) + 8;

	if (mh->fstdw && mh->fstdw != 0xF) {
		for (n = 0; n < 4; n++) {
			if ((mh->fstdw & (0x1 << n)) == 0) {
				p++;
			} else
				break;
		}
	}

	return p;
}